

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int * Gia_ManCreateMuxRefs(Gia_Man_t *p)

{
  Gia_Obj_t *p_00;
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pObj_00;
  bool bVar3;
  int *pMuxRefs;
  int i;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pCtrl;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  pObj = (Gia_Obj_t *)p;
  iVar1 = Gia_ManObjNum(p);
  piVar2 = (int *)calloc((long)iVar1,4);
  pMuxRefs._4_4_ = 0;
  while( true ) {
    bVar3 = false;
    if (pMuxRefs._4_4_ < *(int *)(pObj + 2)) {
      pCtrl = Gia_ManObj((Gia_Man_t *)pObj,pMuxRefs._4_4_);
      bVar3 = pCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjRecognizeExor(pCtrl,&pFan1,(Gia_Obj_t **)&stack0xffffffffffffffd0);
    if ((iVar1 == 0) && (iVar1 = Gia_ObjIsMuxType(pCtrl), iVar1 != 0)) {
      pFan0 = Gia_ObjRecognizeMux(pCtrl,&pFan1,(Gia_Obj_t **)&stack0xffffffffffffffd0);
      p_00 = pObj;
      pObj_00 = Gia_Regular(pFan0);
      iVar1 = Gia_ObjId((Gia_Man_t *)p_00,pObj_00);
      piVar2[iVar1] = piVar2[iVar1] + 1;
    }
    pMuxRefs._4_4_ = pMuxRefs._4_4_ + 1;
  }
  return piVar2;
}

Assistant:

int * Gia_ManCreateMuxRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj, * pCtrl, * pFan0, * pFan1;
    int i, * pMuxRefs;
    pMuxRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjRecognizeExor( pObj, &pFan0, &pFan1 ) )
            continue;
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        pCtrl = Gia_ObjRecognizeMux( pObj, &pFan0, &pFan1 );
        pMuxRefs[ Gia_ObjId(p, Gia_Regular(pCtrl)) ]++;
    }
    return pMuxRefs;
}